

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_secret_arg.cpp
# Opt level: O0

Map * add_room_5(RandomizerWorld *world,MapPalette *pal)

{
  Map *pMVar1;
  Map *pMVar2;
  MapLayout *layout;
  Blockset *value;
  Entity *pEVar3;
  vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_> *this;
  Flag local_110;
  GlobalEntityMaskFlag local_100;
  undefined1 local_e9;
  Attributes local_e8;
  byte local_97;
  byte local_96;
  undefined1 local_95;
  uint8_t y;
  uint8_t x;
  Attributes local_88;
  byte local_31;
  undefined1 local_30 [7];
  uint8_t z;
  Map *local_20;
  Map *map;
  MapPalette *pal_local;
  RandomizerWorld *world_local;
  
  map = (Map *)pal;
  pal_local = (MapPalette *)world;
  pMVar1 = World::map(&world->super_World,0x8e);
  local_20 = pMVar1;
  Flag::Flag((Flag *)local_30,0xc0,'\0');
  Map::visited_flag(pMVar1,(Flag *)local_30);
  pMVar1 = local_20;
  pMVar2 = World::map((World *)pal_local,0x15b);
  layout = Map::layout(pMVar2);
  Map::layout(pMVar1,layout);
  pMVar1 = local_20;
  pMVar2 = World::map((World *)pal_local,0x15b);
  value = Map::blockset(pMVar2);
  Map::blockset(pMVar1,value);
  Map::palette(local_20,(MapPalette *)map);
  Map::background_music(local_20,'\n');
  for (local_31 = 2; pMVar1 = local_20, local_31 < 7; local_31 = local_31 + 2) {
    pEVar3 = (Entity *)operator_new(0x58);
    local_95 = 1;
    local_88.type_id = 'b';
    Position::Position(&local_88.position,'\x13','\x19',local_31,false,false,false);
    local_88.orientation = '\0';
    local_88.palette = '\0';
    local_88.speed = '\0';
    local_88.fightable = false;
    local_88.liftable = false;
    local_88.can_pass_through = false;
    local_88.appear_after_player_moved_away = false;
    local_88.gravity_immune = false;
    local_88.talkable = false;
    local_88.dialogue = '\0';
    local_88.behavior_id = 0;
    local_88.entity_to_use_tiles_from = (Entity *)0x0;
    local_88.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::vector(&local_88.mask_flags);
    Flag::Flag(&local_88.persistence_flag,0xff,0xff);
    local_88.flag_unknown_2_3 = false;
    local_88.flag_unknown_2_4 = false;
    local_88.flag_unknown_3_5 = false;
    Entity::Entity(pEVar3,&local_88);
    local_95 = 0;
    Map::add_entity(pMVar1,pEVar3);
    Entity::Attributes::~Attributes(&local_88);
  }
  for (local_96 = 0x13; local_96 < 0x20; local_96 = local_96 + 0xc) {
    for (local_97 = 0x13; pMVar1 = local_20, local_97 < 0x20; local_97 = local_97 + 0xc) {
      pEVar3 = (Entity *)operator_new(0x58);
      local_e9 = 1;
      local_e8.type_id = 0xd4;
      Position::Position(&local_e8.position,local_96,local_97,'\x1f',true,true,false);
      local_e8.orientation = '\0';
      local_e8.palette = '\x01';
      local_e8.speed = '\0';
      local_e8.fightable = false;
      local_e8.liftable = true;
      local_e8.can_pass_through = false;
      local_e8.appear_after_player_moved_away = false;
      local_e8.gravity_immune = false;
      local_e8.talkable = false;
      local_e8.dialogue = '\0';
      local_e8.behavior_id = 0;
      local_e8.entity_to_use_tiles_from = (Entity *)0x0;
      local_e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::vector(&local_e8.mask_flags);
      Flag::Flag(&local_e8.persistence_flag,0xff,0xff);
      local_e8.flag_unknown_2_3 = false;
      local_e8.flag_unknown_2_4 = false;
      local_e8.flag_unknown_3_5 = false;
      Entity::Entity(pEVar3,&local_e8);
      local_e9 = 0;
      Map::add_entity(pMVar1,pEVar3);
      Entity::Attributes::~Attributes(&local_e8);
    }
  }
  this = Map::global_entity_mask_flags(local_20);
  Flag::Flag(&local_110,&FLAG_SOLVED_ROCKS_RIDDLE);
  GlobalEntityMaskFlag::GlobalEntityMaskFlag(&local_100,&local_110,'\0');
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::
  emplace_back<GlobalEntityMaskFlag>(this,&local_100);
  return local_20;
}

Assistant:

static Map* add_room_5(RandomizerWorld& world, MapPalette* pal)
{
    Map* map = world.map(MAP_SECRET_5);
    map->visited_flag(Flag(0xC0, 0));
    map->layout(world.map(MAP_LAKE_SHRINE_347)->layout());
    map->blockset(world.map(MAP_LAKE_SHRINE_347)->blockset());
    map->palette(pal);
    map->background_music(10);

    for(uint8_t z = 0x2 ; z <= 0x6 ; z += 0x2)
    {
        map->add_entity(new Entity({
            .type_id = ENTITY_ROCK,
            .position = Position(0x13, 0x19, z),
            .palette = 0
        }));
    }

    for(uint8_t x = 0x13; x <= 0x1F ; x += 0xC)
    {
        for(uint8_t y = 0x13; y <= 0x1F ; y += 0xC)
        {
            map->add_entity(new Entity({
                .type_id = 0xC0 + ITEM_GOLDEN_STATUE,
                .position = Position(x, y, 0x1F, true, true),
                .palette = 1,
                .liftable = true
            }));
        }
    }

    map->global_entity_mask_flags().emplace_back(GlobalEntityMaskFlag(FLAG_SOLVED_ROCKS_RIDDLE, 0));
    return map;
}